

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

PrimitiveInstanceSymbol * __thiscall
slang::ast::anon_unknown_287::createPrimInst
          (anon_unknown_287 *this,Compilation *compilation,Scope *scope,PrimitiveSymbol *primitive,
          HierarchicalInstanceSyntax *syntax,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
          attributes,SmallVectorBase<unsigned_int> *path)

{
  int iVar1;
  PrimitiveInstanceSymbol *this_00;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> local_48;
  
  anon_unknown.dwarf_1f374ae::getNameLoc(&local_48,(HierarchicalInstanceSyntax *)primitive);
  this_00 = BumpAllocator::
            emplace<slang::ast::PrimitiveInstanceSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::PrimitiveSymbol_const&>
                      ((BumpAllocator *)this,&local_48.first,&local_48.second,
                       (PrimitiveSymbol *)scope);
  iVar1 = SmallVectorBase<unsigned_int>::copy
                    ((SmallVectorBase<unsigned_int> *)attributes._M_ptr,(EVP_PKEY_CTX *)this,src);
  (this_00->super_InstanceSymbolBase).arrayPath._M_ptr = (pointer)CONCAT44(extraout_var,iVar1);
  (this_00->super_InstanceSymbolBase).arrayPath._M_extent._M_extent_value = extraout_RDX;
  (this_00->super_InstanceSymbolBase).super_Symbol.originatingSyntax = (SyntaxNode *)primitive;
  syntax_00._M_extent._M_extent_value = (size_t)path;
  syntax_00._M_ptr = (pointer)syntax;
  Symbol::setAttributes((Symbol *)this_00,(Scope *)compilation,syntax_00);
  return this_00;
}

Assistant:

PrimitiveInstanceSymbol* createPrimInst(Compilation& compilation, const Scope& scope,
                                        const PrimitiveSymbol& primitive,
                                        const HierarchicalInstanceSyntax& syntax,
                                        std::span<const AttributeInstanceSyntax* const> attributes,
                                        SmallVectorBase<uint32_t>& path) {
    auto [name, loc] = getNameLoc(syntax);
    auto result = compilation.emplace<PrimitiveInstanceSymbol>(name, loc, primitive);
    result->arrayPath = path.copy(compilation);
    result->setSyntax(syntax);
    result->setAttributes(scope, attributes);
    return result;
}